

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spcdas.cpp
# Opt level: O0

void disas(byte o,char *s,byte a,byte b,byte c,byte d)

{
  char cVar1;
  size_t sVar2;
  uint local_104c;
  int local_1048;
  uint v;
  int z;
  int pos;
  int x;
  int i;
  char t [16];
  char ws [4096];
  byte d_local;
  byte c_local;
  byte b_local;
  byte a_local;
  char *s_local;
  byte o_local;
  
  v = 0;
  if (spc.addr) {
    sprintf(t + 8,"%04x: ",(ulong)spc.pc);
  }
  else {
    strcpy(t + 8,"");
  }
  if ((spc.hex & 1U) == 1) {
    for (pos = 0; pos < (int)(uint)o; pos = pos + 1) {
      sprintf((char *)&x,"%02x ",(ulong)spc.mem[(int)((uint)spc.pc + pos)]);
      strcat(t + 8,(char *)&x);
    }
    for (; pos < 3; pos = pos + 1) {
      strcat(t + 8,"   ");
    }
    strcat(t + 8," ");
  }
  sVar2 = strlen(t + 8);
  local_1048 = (int)sVar2;
  for (pos = 0; sVar2 = strlen(s), pos < (int)sVar2; pos = pos + 1) {
    if (s[pos] == '*') {
      pos = pos + 1;
      cVar1 = s[pos];
      if (cVar1 == 'b') {
        if (v == 0) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)a)];
        }
        else if (v == 1) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)b)];
        }
        else if (v == 2) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)c)];
        }
        else if (v == 3) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)d)];
        }
        v = v + 1;
        sprintf((char *)&x,"%02x",(ulong)(local_104c & 0xff));
      }
      else if (cVar1 == 'w') {
        if (v == 0) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)a + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)a)]);
        }
        else if (v == 1) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)b + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)b)]);
        }
        else if (v == 2) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)c + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)c)]);
        }
        else if (v == 3) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)d + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)d)]);
        }
        v = v + 1;
        sprintf((char *)&x,"%04x",(ulong)(local_104c & 0xffff));
      }
      else if (cVar1 == 'm') {
        if (v == 0) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)a + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)a)]);
        }
        else if (v == 1) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)b + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)b)]);
        }
        else if (v == 2) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)c + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)c)]);
        }
        else if (v == 3) {
          local_104c = (uint)CONCAT11(spc.mem[(int)((uint)spc.pc + (uint)d + 1)],
                                      spc.mem[(int)((uint)spc.pc + (uint)d)]);
        }
        v = v + 1;
        sprintf((char *)&x,"%04x,%d",(ulong)(local_104c & 0x1fff),(ulong)(local_104c >> 0xd));
      }
      else if (cVar1 == 'r') {
        if (v == 0) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)a)];
        }
        else if (v == 1) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)b)];
        }
        else if (v == 2) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)c)];
        }
        else if (v == 3) {
          local_104c = (uint)spc.mem[(int)((uint)spc.pc + (uint)d)];
        }
        v = v + 1;
        if ((spc.rel & 1U) == 1) {
          local_104c = (uint)spc.pc + (uint)o + (int)(char)local_104c;
          sprintf((char *)&x,"%04x",(ulong)(local_104c & 0xffff));
        }
        else {
          sprintf((char *)&x,"%02x",(ulong)(local_104c & 0xff));
        }
      }
      t[(long)local_1048 + 8] = '\0';
      strcat(t + 8,(char *)&x);
      sVar2 = strlen((char *)&x);
      local_1048 = local_1048 + (int)sVar2;
    }
    else {
      t[(long)local_1048 + 8] = s[pos];
      local_1048 = local_1048 + 1;
    }
  }
  t[(long)local_1048 + 8] = '\0';
  fprintf((FILE *)wr,"%s\r\n",t + 8);
  spc.pc = spc.pc + o;
  return;
}

Assistant:

void disas(byte o, const char *s, byte a = 0, byte b = 0, byte c = 0, byte d = 0) {
char ws[4096], t[16];
int i, x, pos = 0, z;
uint v;
  if(spc.addr == true) {
    sprintf(ws, "%04x: ", spc.pc);
  } else {
    strcpy(ws, "");
  }
  if(spc.hex == true) {
    for(i=0;i<o;i++) {
      sprintf(t, "%02x ", spc.mem[spc.pc+i]);
      strcat(ws, t);
    }
    for(;i<3;i++) {
      strcat(ws, "   ");
    }
    strcat(ws, " ");
  }
  z=strlen(ws);
  for(i=0;i<(int)strlen(s);i++) {
    if(s[i]=='*') {
      x=s[++i];
      if(x=='b') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        sprintf(t, "%02x", v&0xff);
      } else if(x=='w') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x", v&0xffff);
      } else if(x=='m') {
        if     (pos == 0)v=spc.mem[spc.pc+a]|(spc.mem[spc.pc+a+1]<<8);
        else if(pos == 1)v=spc.mem[spc.pc+b]|(spc.mem[spc.pc+b+1]<<8);
        else if(pos == 2)v=spc.mem[spc.pc+c]|(spc.mem[spc.pc+c+1]<<8);
        else if(pos == 3)v=spc.mem[spc.pc+d]|(spc.mem[spc.pc+d+1]<<8);
        pos++;
        sprintf(t, "%04x,%d", v&0x1fff, v>>13);
      } else if(x=='r') {
        if     (pos == 0)v=spc.mem[spc.pc+a];
        else if(pos == 1)v=spc.mem[spc.pc+b];
        else if(pos == 2)v=spc.mem[spc.pc+c];
        else if(pos == 3)v=spc.mem[spc.pc+d];
        pos++;
        if(spc.rel == true) {
          v=(spc.pc+o)+(signed char)v;
          sprintf(t, "%04x", v&0xffff);
        } else {
          sprintf(t, "%02x", v&0xff);
        }
      }
      ws[z]=0;
      strcat(ws, t);
      z+=strlen(t);
    } else {
      ws[z++]=s[i];
    }
  }
  ws[z]=0;
  fprintf(wr, "%s\r\n", ws);

  spc.pc+=o;
}